

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O3

int cli::extract(Parser *parse,Option *options)

{
  uint uVar1;
  int iVar2;
  size_type sVar3;
  Entry *entry;
  long lVar4;
  pointer ppEVar5;
  bool bVar6;
  char cVar7;
  Version VVar8;
  Compression CVar9;
  ostream *poVar10;
  undefined8 *puVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  Version version;
  Compression compression;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t size_00;
  uint32_t size_01;
  uint32_t size_02;
  uint32_t size_03;
  uint32_t size_04;
  ulong extraout_RDX;
  ulong uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  char *pcVar17;
  int iVar18;
  _Alloc_hider _Var19;
  uint uVar20;
  pointer ppEVar21;
  string outPath;
  EntryList filelist;
  char *data;
  EntryList list;
  size_t size;
  string path;
  Archive archive;
  fstream stream;
  string local_338;
  ulong local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  string local_308;
  char *local_2e0;
  EntryList local_2d8;
  size_t local_2b8;
  long local_2b0;
  string local_2a8;
  Archive local_288;
  string local_240 [16];
  
  if (parse->nonop_count < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Filename required",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,*parse->nonop_args,(allocator<char> *)local_240);
  ZAP::Archive::Archive(&local_288);
  bVar6 = ZAP::Archive::openFile(&local_288,&local_2a8);
  if (bVar6) {
    if (options[2].desc == (Descriptor *)0x0) {
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,".","");
      sVar3 = local_338._M_string_length;
      if (1 < parse->nonop_count) {
        pcVar17 = parse->nonop_args[1];
        strlen(pcVar17);
        std::__cxx11::string::_M_replace((ulong)&local_338,0,(char *)sVar3,(ulong)pcVar17);
      }
      cVar7 = isDirectory(&local_338);
      if ((bool)cVar7) {
        local_2d8.
        super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2d8.
        super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2d8.
        super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ZAP::Archive::getFileList(&local_288,&local_2d8);
        ppEVar5 = local_2d8.
                  super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_2d8.
            super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_2d8.
            super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_318 = CONCAT71(local_318._1_7_,cVar7);
          ppEVar21 = local_2d8.
                     super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          do {
            entry = *ppEVar21;
            local_240[0]._M_dataplus._M_p = (pointer)&local_240[0].field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_240,local_338._M_dataplus._M_p,
                       (char *)(local_338._M_string_length + (long)local_338._M_dataplus._M_p));
            std::__cxx11::string::_M_replace_aux
                      ((ulong)local_240,
                       CONCAT44(local_240[0]._M_string_length._4_4_,
                                (uint)local_240[0]._M_string_length),0,'\x01');
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)local_240,(ulong)(entry->virtual_path)._M_dataplus._M_p);
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar12) {
              local_308.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_308.field_2._8_8_ = puVar11[3];
              local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
            }
            else {
              local_308.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_308._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_308._M_string_length = puVar11[1];
            *puVar11 = paVar12;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240[0]._M_dataplus._M_p != &local_240[0].field_2) {
              operator_delete(local_240[0]._M_dataplus._M_p,
                              local_240[0].field_2._M_allocated_capacity + 1);
            }
            cleanPath(&local_308);
            bVar6 = createPath(&local_308);
            if (bVar6) {
              std::fstream::fstream(local_240,local_308._M_dataplus._M_p,_S_trunc|_S_out|_S_bin);
              cVar7 = std::__basic_file<char>::is_open();
              if (cVar7 == '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Could not create entry ",0x17);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(entry->virtual_path)._M_dataplus._M_p,
                                     (entry->virtual_path)._M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
              }
              else {
                if (options[7].desc == (Descriptor *)0x0) {
                  bVar6 = ZAP::Archive::getData(&local_288,entry,&local_2e0,&local_2b8);
                }
                else {
                  bVar6 = ZAP::Archive::getRawData(&local_288,entry,&local_2e0,&local_2b8);
                }
                if (bVar6 == false) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Could not extract entry ",0x18);
                  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,(entry->virtual_path)._M_dataplus._M_p,
                                       (entry->virtual_path)._M_string_length);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                }
                else {
                  std::ostream::write(local_240[0].field_2._M_local_buf,(long)local_2e0);
                  if (local_2e0 != (char *)0x0) {
                    operator_delete__(local_2e0);
                  }
                }
              }
              std::fstream::~fstream(local_240);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Could not create path ",0x16);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_308._M_dataplus._M_p,
                                   local_308._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_308._M_dataplus._M_p != &local_308.field_2) {
              operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1
                             );
            }
            ppEVar21 = ppEVar21 + 1;
          } while (ppEVar21 != ppEVar5);
          cVar7 = (char)local_318;
        }
        if (local_2d8.
            super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d8.
                          super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_2d8.
                                super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2d8.
                                super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Output is not a directory",0x19);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
        std::ostream::put(-0x60);
        std::ostream::flush();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      iVar14 = 1;
      if (cVar7 == '\0') goto LAB_0010e74a;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Version: ",9);
      VVar8 = ZAP::Archive::getVersion(&local_288);
      getPrettyVersion_abi_cxx11_(local_240,(cli *)(ulong)VVar8,version);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_240[0]._M_dataplus._M_p,
                           CONCAT44(local_240[0]._M_string_length._4_4_,
                                    (uint)local_240[0]._M_string_length));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nCompression: ",0xe);
      CVar9 = ZAP::Archive::getCompression(&local_288);
      getPrettyCompression_abi_cxx11_(&local_338,(cli *)(ulong)CVar9,compression);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_338._M_dataplus._M_p,local_338._M_string_length);
      bVar6 = ZAP::Archive::isSupportedCompression(&local_288);
      pcVar17 = " (unsupported)";
      if (bVar6) {
        pcVar17 = " (supported)";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar17,(ulong)!bVar6 * 2 + 0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nFile count: ",0xd);
      ZAP::Archive::getFileCount(&local_288);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240[0]._M_dataplus._M_p != &local_240[0].field_2) {
        operator_delete(local_240[0]._M_dataplus._M_p,local_240[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_308._M_dataplus._M_p = (pointer)0x0;
      local_308._M_string_length = 0;
      local_308.field_2._M_allocated_capacity = 0;
      ZAP::Archive::getFileList(&local_288,(EntryList *)&local_308);
      local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_string_length;
      if (local_308._M_dataplus._M_p == (pointer)local_308._M_string_length) {
        lVar15 = 5;
        local_318 = 0xb;
        local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0xd;
      }
      else {
        uVar16 = 0xd;
        iVar18 = 0xb;
        iVar14 = 5;
        uVar13 = extraout_RDX;
        _Var19._M_p = local_308._M_dataplus._M_p;
        do {
          sVar3 = *(size_type *)_Var19._M_p;
          iVar2 = *(int *)(sVar3 + 8);
          getPrettySize_abi_cxx11_(local_240,(cli *)(ulong)*(uint *)(sVar3 + 0x28),(uint32_t)uVar13)
          ;
          local_318 = (ulong)(uint)local_240[0]._M_string_length;
          size_00 = extraout_EDX;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240[0]._M_dataplus._M_p != &local_240[0].field_2) {
            operator_delete(local_240[0]._M_dataplus._M_p,
                            local_240[0].field_2._M_allocated_capacity + 1);
            size_00 = extraout_EDX_00;
          }
          getPrettySize_abi_cxx11_(local_240,(cli *)(ulong)*(uint *)(sVar3 + 0x24),size_00);
          uVar20 = (uint)local_240[0]._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240[0]._M_dataplus._M_p != &local_240[0].field_2) {
            operator_delete(local_240[0]._M_dataplus._M_p,
                            local_240[0].field_2._M_allocated_capacity + 1);
          }
          uVar1 = uVar20 + 1;
          uVar13 = (ulong)uVar1;
          if (iVar14 <= iVar2) {
            iVar14 = iVar2 + 1;
          }
          if (iVar18 <= (int)local_318) {
            iVar18 = (int)local_318 + 1;
          }
          if ((int)uVar16 <= (int)uVar20) {
            uVar16 = uVar1;
          }
          _Var19._M_p = _Var19._M_p + 8;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var19._M_p != local_310);
        lVar15 = (long)iVar14;
        local_318 = (ulong)iVar18;
        local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(long)(int)uVar16;
      }
      lVar4 = std::cout;
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) | 0x20;
      *(long *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar4 + -0x18)) = lVar15;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Path",4);
      lVar4 = std::cout;
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) | 0x80;
      *(ulong *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar4 + -0x18)) = local_318;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Comp. size",10);
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = local_310;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Decomp. size",0xc);
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffff7f;
      local_240[0]._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_240,1);
      sVar3 = local_308._M_string_length;
      if (local_308._M_dataplus._M_p == (pointer)local_308._M_string_length) {
        uVar16 = 0;
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        uVar16 = 0;
        _Var19._M_p = local_308._M_dataplus._M_p;
        local_2b0 = lVar15;
        do {
          lVar15 = std::cout;
          puVar11 = *(undefined8 **)_Var19._M_p;
          uVar20 = uVar20 + *(int *)(puVar11 + 5);
          uVar16 = uVar16 + *(int *)((long)puVar11 + 0x24);
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) | 0x20;
          *(long *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar15 + -0x18)) =
               local_2b0;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)*puVar11,puVar11[1]);
          lVar15 = *(long *)poVar10;
          *(uint *)(poVar10 + *(long *)(lVar15 + -0x18) + 0x18) =
               *(uint *)(poVar10 + *(long *)(lVar15 + -0x18) + 0x18) | 0x80;
          *(ulong *)(poVar10 + *(long *)(lVar15 + -0x18) + 0x10) = local_318;
          getPrettySize_abi_cxx11_(local_240,(cli *)(ulong)*(uint *)(puVar11 + 5),size_01);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_240[0]._M_dataplus._M_p,
                               CONCAT44(local_240[0]._M_string_length._4_4_,
                                        (uint)local_240[0]._M_string_length));
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = local_310;
          getPrettySize_abi_cxx11_(&local_338,(cli *)(ulong)*(uint *)((long)puVar11 + 0x24),size_02)
          ;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_338._M_dataplus._M_p,local_338._M_string_length);
          *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
               *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffff7f;
          local_2d8.
          super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT71(local_2d8.
                                 super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_2d8,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240[0]._M_dataplus._M_p != &local_240[0].field_2) {
            operator_delete(local_240[0]._M_dataplus._M_p,
                            local_240[0].field_2._M_allocated_capacity + 1);
          }
          _Var19._M_p = _Var19._M_p + 8;
        } while (_Var19._M_p != (pointer)sVar3);
      }
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
           0x10;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nTotal comp.: ",0xe);
      getPrettySize_abi_cxx11_(local_240,(cli *)(ulong)uVar20,size_03);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_240[0]._M_dataplus._M_p,
                           CONCAT44(local_240[0]._M_string_length._4_4_,
                                    (uint)local_240[0]._M_string_length));
      *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 0x10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nTotal decomp.: ",0x10);
      getPrettySize_abi_cxx11_(&local_338,(cli *)(ulong)uVar16,size_04);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_338._M_dataplus._M_p,local_338._M_string_length);
      local_2d8.
      super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_2d8.
                             super__Vector_base<const_ZAP::Archive::Entry_*,_std::allocator<const_ZAP::Archive::Entry_*>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_2d8,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240[0]._M_dataplus._M_p != &local_240[0].field_2) {
        operator_delete(local_240[0]._M_dataplus._M_p,local_240[0].field_2._M_allocated_capacity + 1
                       );
      }
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_308._M_dataplus._M_p,
                        local_308.field_2._M_allocated_capacity - (long)local_308._M_dataplus._M_p);
      }
    }
    iVar14 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open archive",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    iVar14 = 1;
    std::ostream::flush();
  }
LAB_0010e74a:
  ZAP::Archive::~Archive(&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  return iVar14;
}

Assistant:

int extract(option::Parser &parse, option::Option *options)
	{
		if (parse.nonOptionsCount() < 1)
		{
			std::cerr << "Filename required" << std::endl;
			return 1;
		}
		std::string path = parse.nonOption(0);

		ZAP::Archive archive;
		if (!archive.openFile(path))
		{
			std::cerr << "Could not open archive" << std::endl;
			return 1;
		}

		if (options[LIST])
		{
			print(archive);
		}
		else
		{
			std::string outPath = ".";
			if (parse.nonOptionsCount() >= 2)
			{
				outPath = parse.nonOption(1);
			}
			if (!isDirectory(outPath))
			{
				std::cerr << "Output is not a directory" << std::endl;
				return 1;
			}

			ZAP::Archive::EntryList list;
			archive.getFileList(list);

			for (const ZAP::Archive::Entry *entry : list)
			{
				std::string fullpath = (outPath + '/' + entry->virtual_path);
				cleanPath(fullpath);
				if (!createPath(fullpath))
				{
					std::cerr << "Could not create path " << fullpath << std::endl;
					continue;
				}

				std::fstream stream(fullpath.c_str(), std::ios::out | std::ios::binary | std::ios::trunc);
				if (!stream.is_open())
				{
					std::cerr << "Could not create entry " << entry->virtual_path << std::endl;
					continue;
				}

				char *data;
				size_t size;

				bool extractSuccess = false;
				if (options[RAW])
					extractSuccess = archive.getRawData(entry, data, size);
				else
					extractSuccess = archive.getData(entry, data, size);

				if (!extractSuccess)
				{
					std::cerr << "Could not extract entry " << entry->virtual_path << std::endl;
					continue;
				}

				stream.write(data, size);

				delete[] data;
			}
		}

		return 0;
	}